

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
          (string *__return_storage_ptr__,HexEncoder *this,uchar *bytes,int offset,
          size_t len_to_read,size_t len_of_bytes)

{
  HexEncoder HVar1;
  undefined4 in_register_0000000c;
  ulong uVar2;
  ulong uVar3;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar2 = (ulong)(int)bytes;
  uVar3 = CONCAT44(in_register_0000000c,offset) + uVar2;
  if (len_to_read <= uVar3) {
    uVar3 = len_to_read;
  }
  for (; uVar2 < uVar3; uVar2 = uVar2 + 1) {
    HVar1 = this[uVar2];
    std::operator<<(local_1a8,*(char *)(HEX_CHARS + (ulong)((byte)HVar1 >> 4)));
    std::operator<<(local_1a8,*(char *)(HEX_CHARS + (ulong)((byte)HVar1 & 0xf)));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string HexEncoder::EncodeAsHex(unsigned char* bytes, int offset, size_t len_to_read, size_t len_of_bytes)
{
    std::stringstream ss;

    for (int index = offset; index < offset + len_to_read && index < len_of_bytes; ++index)
    {
        unsigned int byte = (unsigned int) bytes[index];

        ss << HEX_CHARS[byte >> 4u & 0xfu];
        ss << HEX_CHARS[byte & 0xfu];
    }

    return ss.str();
}